

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O2

int dropt_vssprintf(dropt_stringstream *ss,dropt_char *format,__va_list_tag *args)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  size_t __maxlen;
  ulong n;
  va_list argsCopy;
  
  if (ss == (dropt_stringstream *)0x0) {
    __assert_fail("ss != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0x282,
                  "int dropt_vssprintf(dropt_stringstream *, const dropt_char *, struct __va_list_tag *)"
                 );
  }
  if (format != (dropt_char *)0x0) {
    argsCopy[0].reg_save_area = args->reg_save_area;
    argsCopy[0].gp_offset = args->gp_offset;
    argsCopy[0].fp_offset = args->fp_offset;
    argsCopy[0].overflow_arg_area = args->overflow_arg_area;
    uVar2 = vsnprintf((char *)0x0,0,format,argsCopy);
    if (0 < (int)uVar2) {
      __maxlen = dropt_ssgetfreespace(ss);
      if (__maxlen <= uVar2) {
        uVar1 = ss->maxSize * 2;
        n = (ulong)uVar2 + ss->maxSize;
        if (n < uVar1) {
          n = uVar1;
        }
        dropt_ssresize(ss,n);
        __maxlen = dropt_ssgetfreespace(ss);
        if (__maxlen == 0) {
          __assert_fail("available > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                        ,0x296,
                        "int dropt_vssprintf(dropt_stringstream *, const dropt_char *, struct __va_list_tag *)"
                       );
        }
      }
      uVar3 = vsnprintf(ss->string + ss->used,__maxlen,format,args);
      uVar2 = 0xffffffff;
      if (uVar3 < __maxlen) {
        uVar2 = uVar3;
      }
      if (0 < (int)uVar2) {
        ss->used = ss->used + (ulong)uVar2;
        uVar2 = uVar3;
      }
    }
    return uVar2;
  }
  __assert_fail("format != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                ,0x283,
                "int dropt_vssprintf(dropt_stringstream *, const dropt_char *, struct __va_list_tag *)"
               );
}

Assistant:

int
dropt_vssprintf(dropt_stringstream* ss, const dropt_char* format, va_list args)
{
    int n;
    va_list argsCopy;
    assert(ss != NULL);
    assert(format != NULL);

    va_copy(argsCopy, args);
    n = dropt_vsnprintf(NULL, 0, format, argsCopy);
    va_end(argsCopy);

    if (n > 0)
    {
        size_t available = dropt_ssgetfreespace(ss);
        if ((unsigned int) n >= available)
        {
            /* It's possible that `newSize < ss->maxSize` if
             * `GROWN_STRINGSTREAM_BUFFER_SIZE()` overflows, but it should be
             * safe since we'll recompute the available space.
             */
            size_t newSize = GROWN_STRINGSTREAM_BUFFER_SIZE(ss->maxSize, n);
            dropt_ssresize(ss, newSize);
            available = dropt_ssgetfreespace(ss);
        }
        assert(available > 0); /* Space always is reserved for NUL. */

        /* `snprintf`'s family of functions return the number of characters
         * that would be output with a sufficiently large buffer, excluding
         * `NUL`.
         */
        n = dropt_vsnprintf(ss->string + ss->used, available, format, args);

        /* We couldn't allocate enough space. */
        if ((unsigned int) n >= available) { n = -1; }

        if (n > 0) { ss->used += n; }
    }
    return n;
}